

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O1

void __thiscall
deci::parser_t::basic_symbol<deci::parser_t::by_kind>::clear
          (basic_symbol<deci::parser_t::by_kind> *this)

{
  switch((this->super_by_kind).kind_) {
  case S_NUMBER:
    value_type::as<double>(&this->value);
    break;
  case S_IDENTIFIER:
  case S_CMP_OPERATOR:
    value_type::destroy<std::__cxx11::string>(&this->value);
  default:
    goto switchD_0011045a_caseD_5;
  case S_42_argument_list_:
  case S_argument_list:
    value_type::as<deci::ast_arg_list_t*>(&this->value);
    break;
  case S_43_statement_list_:
  case S_statement_list:
    value_type::as<deci::ast_t*>(&this->value);
    break;
  case S_statement:
  case S_expression_statement:
  case S_expression:
  case S_assign_expr:
  case S_or_expr:
  case S_xor_expr:
  case S_and_expr:
  case S_eql_expr:
  case S_cmp_expr:
  case S_add_expr:
  case S_mul_expr:
  case S_pow_expr:
  case S_unary_expr:
  case S_postfix_expr:
  case S_primary_expr:
  case S_if_statement:
  case S_for_statement:
  case S_while_statement:
  case S_repeat_statement:
    value_type::as<deci::ast_item_t*>(&this->value);
    break;
  case S_exit_statement:
    value_type::as<deci::ast_exit_t*>(&this->value);
  }
  (this->value).yytypeid_ = (type_info *)0x0;
switchD_0011045a_caseD_5:
  (this->super_by_kind).kind_ = S_YYEMPTY;
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.template destroy< ast_arg_list_t* > ();
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.template destroy< ast_exit_t* > ();
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.template destroy< ast_item_t* > ();
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.template destroy< ast_t* > ();
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.template destroy< double > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }